

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregator.cpp
# Opt level: O1

void __thiscall
duckdb::WindowAggregator::Sink
          (WindowAggregator *this,WindowAggregatorState *gstate,WindowAggregatorState *lstate,
          DataChunk *sink_chunk,DataChunk *coll_chunk,idx_t input_idx,
          optional_ptr<duckdb::SelectionVector,_true> filter_sel,idx_t filtered)

{
  free_function_ptr_t p_Var1;
  ulong uVar2;
  ulong uVar3;
  optional_ptr<duckdb::SelectionVector,_true> local_30;
  
  local_30.ptr = filter_sel.ptr;
  if ((filter_sel.ptr != (SelectionVector *)0x0) && (filtered != 0)) {
    uVar3 = 0;
    do {
      optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_30);
      uVar2 = uVar3;
      if ((local_30.ptr)->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)(local_30.ptr)->sel_vector[uVar3];
      }
      p_Var1 = gstate[5].allocator.arena_allocator.free_function;
      if (p_Var1 != (free_function_ptr_t)0x0) {
        p_Var1[input_idx + uVar2] = (_func_void_PrivateAllocatorData_ptr_data_ptr_t_idx_t)0x1;
      }
      uVar3 = uVar3 + 1;
    } while (filtered != uVar3);
  }
  return;
}

Assistant:

void WindowAggregator::Sink(WindowAggregatorState &gstate, WindowAggregatorState &lstate, DataChunk &sink_chunk,
                            DataChunk &coll_chunk, idx_t input_idx, optional_ptr<SelectionVector> filter_sel,
                            idx_t filtered) {
	auto &gastate = gstate.Cast<WindowAggregatorGlobalState>();
	auto &lastate = lstate.Cast<WindowAggregatorLocalState>();
	lastate.Sink(gastate, sink_chunk, coll_chunk, input_idx);
	if (filter_sel) {
		auto &filter_mask = gastate.filter_mask;
		for (idx_t f = 0; f < filtered; ++f) {
			filter_mask.SetValid(input_idx + filter_sel->get_index(f));
		}
	}
}